

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

void __thiscall
cs_impl::any::any<std::shared_ptr<std::__cxx11::stringstream>>
          (any *this,
          shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *dat)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  baseHolder *pbVar2;
  proxy *ppVar3;
  
  if ((DAT_0025ef28 == 0) || (cs::global_thread_counter != 0)) {
    pbVar2 = (baseHolder *)operator_new(0x18);
  }
  else {
    pbVar2 = *(baseHolder **)(&hash_gen_base<std::_Ios_Openmode>::base_code + DAT_0025ef28 * 8);
    DAT_0025ef28 = DAT_0025ef28 + -1;
  }
  pbVar2->_vptr_baseHolder = (_func_int **)&PTR__holder_002547b8;
  pbVar2[1]._vptr_baseHolder =
       (_func_int **)
       (dat->
       super___shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       )._M_ptr;
  p_Var1 = (dat->
           super___shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  pbVar2[2]._vptr_baseHolder = (_func_int **)p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  if ((DAT_0025be20 == 0) || (cs::global_thread_counter != 0)) {
    ppVar3 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar3 = (proxy *)(&cs::null_pointer)[DAT_0025be20];
    DAT_0025be20 = DAT_0025be20 + -1;
  }
  ppVar3->is_rvalue = false;
  ppVar3->protect_level = 0;
  ppVar3->refcount = 1;
  ppVar3->data = pbVar2;
  this->mDat = ppVar3;
  return;
}

Assistant:

any(const T &dat):mDat(allocator.alloc(1, holder<T>::allocator.alloc(dat))) {}